

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O0

cmd_ln_t * cmd_ln_parse_r(cmd_ln_t *inout_cmdln,arg_t *defn,int32 argc,char **argv,int strict)

{
  void *cmdln_00;
  int32 iVar1;
  hash_table_t *phVar2;
  FILE *pFVar3;
  void *local_90;
  void *v_3;
  void *v_2;
  cmd_ln_val_t *val_1;
  void *v_1;
  cmd_ln_val_t *val;
  arg_t *argdef;
  void *v;
  cmd_ln_t *cmdln;
  hash_table_t *defidx;
  int local_40;
  int32 argstart;
  int32 n;
  int32 j;
  int32 i;
  int strict_local;
  char **argv_local;
  arg_t *paStack_20;
  int32 argc_local;
  arg_t *defn_local;
  cmd_ln_t *inout_cmdln_local;
  
  cmdln = (cmd_ln_t *)0x0;
  v = inout_cmdln;
  j = strict;
  _i = argv;
  argv_local._4_4_ = argc;
  paStack_20 = defn;
  defn_local = (arg_t *)inout_cmdln;
  if (inout_cmdln == (cmd_ln_t *)0x0) {
    v = __ckd_calloc__(1,0x20,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                       ,0x234);
    *(undefined4 *)v = 1;
  }
  cmdln = (cmd_ln_t *)hash_table_new(0x32,0);
  if (paStack_20 == (arg_t *)0x0) {
    local_40 = 0;
  }
  else {
    local_40 = 0;
    while (paStack_20[local_40].name != (char *)0x0) {
      argdef = (arg_t *)hash_table_enter((hash_table_t *)cmdln,paStack_20[local_40].name,
                                         paStack_20 + local_40);
      if ((j != 0) && (argdef != paStack_20 + local_40)) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                ,0x242,"Duplicate argument name in definition: %s\n",paStack_20[local_40].name);
        goto LAB_00106127;
      }
      local_40 = local_40 + 1;
    }
  }
  if (*(long *)((long)v + 8) == 0) {
    phVar2 = hash_table_new(local_40,0);
    *(hash_table_t **)((long)v + 8) = phVar2;
  }
  defidx._4_4_ = 0;
  if ((0 < argv_local._4_4_) && (**_i != '-')) {
    defidx._4_4_ = 1;
  }
  for (argstart = defidx._4_4_; argstart < argv_local._4_4_; argstart = argstart + 2) {
    iVar1 = hash_table_lookup((hash_table_t *)cmdln,_i[argstart],&val_1);
    if (iVar1 < 0) {
      if (j != 0) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                ,0x25f,"Unknown argument name \'%s\'\n",_i[argstart]);
        goto LAB_00106127;
      }
      if (paStack_20 == (arg_t *)0x0) {
        val_1 = (cmd_ln_val_t *)0x0;
        goto LAB_00105d09;
      }
    }
    else {
LAB_00105d09:
      val = val_1;
      if (argv_local._4_4_ <= argstart + 1) {
        cmd_ln_print_help_r((cmd_ln_t *)v,_stderr,paStack_20);
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                ,0x26c,"Argument value for \'%s\' missing\n",_i[argstart]);
        goto LAB_00106127;
      }
      if (val_1 == (cmd_ln_val_t *)0x0) {
        v_1 = cmd_ln_val_init(8,_i[argstart],_i[argstart + 1]);
      }
      else {
        v_1 = cmd_ln_val_init(val_1->type,_i[argstart],_i[argstart + 1]);
        if ((cmd_ln_val_t *)v_1 == (cmd_ln_val_t *)0x0) {
          cmd_ln_print_help_r((cmd_ln_t *)v,_stderr,paStack_20);
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                  ,0x276,"Bad argument value for %s: %s\n",_i[argstart],_i[argstart + 1]);
          goto LAB_00106127;
        }
      }
      val_1 = (cmd_ln_val_t *)
              hash_table_enter(*(hash_table_t **)((long)v + 8),*(char **)((long)v_1 + 0x10),v_1);
      if (val_1 != (cmd_ln_val_t *)v_1) {
        if (j != 0) {
          cmd_ln_val_free((cmd_ln_val_t *)v_1);
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                  ,0x281,"Duplicate argument name in arguments: %s\n",(val->val).ptr);
          goto LAB_00106127;
        }
        val_1 = (cmd_ln_val_t *)
                hash_table_replace(*(hash_table_t **)((long)v + 8),*(char **)((long)v_1 + 0x10),v_1)
        ;
        cmd_ln_val_free(val_1);
      }
    }
  }
  n = 0;
  do {
    if (local_40 <= n) {
      argstart = 0;
      for (n = 0; n < local_40; n = n + 1) {
        if (((paStack_20[n].type & 1U) != 0) &&
           (iVar1 = hash_table_lookup(*(hash_table_t **)((long)v + 8),paStack_20[n].name,&local_90),
           iVar1 != 0)) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                  ,0x2a1,"Missing required argument %s\n",paStack_20[n].name);
        }
      }
      if (argstart < 1) {
        if ((j == 0) || (argv_local._4_4_ != 1)) {
          pFVar3 = err_get_logfp();
          cmdln_00 = v;
          if (pFVar3 != (FILE *)0x0) {
            pFVar3 = err_get_logfp();
            cmd_ln_print_values_r((cmd_ln_t *)cmdln_00,pFVar3,paStack_20);
          }
          hash_table_free((hash_table_t *)cmdln);
          inout_cmdln_local = (cmd_ln_t *)v;
        }
        else {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                  ,0x2aa,"No arguments given, available options are:\n");
          cmd_ln_print_help_r((cmd_ln_t *)v,_stderr,paStack_20);
          if (cmdln != (cmd_ln_t *)0x0) {
            hash_table_free((hash_table_t *)cmdln);
          }
          if (defn_local == (arg_t *)0x0) {
            cmd_ln_free_r((cmd_ln_t *)v);
          }
          inout_cmdln_local = (cmd_ln_t *)0x0;
        }
      }
      else {
        cmd_ln_print_help_r((cmd_ln_t *)v,_stderr,paStack_20);
LAB_00106127:
        if (cmdln != (cmd_ln_t *)0x0) {
          hash_table_free((hash_table_t *)cmdln);
        }
        if (defn_local == (arg_t *)0x0) {
          cmd_ln_free_r((cmd_ln_t *)v);
        }
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                ,0x2bf,"Failed to parse arguments list\n");
        inout_cmdln_local = (cmd_ln_t *)0x0;
      }
      return inout_cmdln_local;
    }
    iVar1 = hash_table_lookup(*(hash_table_t **)((long)v + 8),paStack_20[n].name,&v_3);
    if (iVar1 < 0) {
      v_2 = cmd_ln_val_init(paStack_20[n].type,paStack_20[n].name,paStack_20[n].deflt);
      if ((cmd_ln_val_t *)v_2 == (cmd_ln_val_t *)0x0) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                ,0x294,"Bad default argument value for %s: %s\n",paStack_20[n].name,
                paStack_20[n].deflt);
        goto LAB_00106127;
      }
      hash_table_enter(*(hash_table_t **)((long)v + 8),((cmd_ln_val_t *)v_2)->name,v_2);
    }
    n = n + 1;
  } while( true );
}

Assistant:

cmd_ln_t *
cmd_ln_parse_r(cmd_ln_t *inout_cmdln, const arg_t * defn, int32 argc, char *argv[], int strict)
{
    int32 i, j, n, argstart;
    hash_table_t *defidx = NULL;
    cmd_ln_t *cmdln;

    /* Construct command-line object */
    if (inout_cmdln == NULL) {
        cmdln = (cmd_ln_t*)ckd_calloc(1, sizeof(*cmdln));
        cmdln->refcount = 1;
    }
    else
        cmdln = inout_cmdln;

    /* Build a hash table for argument definitions */
    defidx = hash_table_new(50, 0);
    if (defn) {
        for (n = 0; defn[n].name; n++) {
            void *v;

            v = hash_table_enter(defidx, defn[n].name, (void *)&defn[n]);
            if (strict && (v != &defn[n])) {
                E_ERROR("Duplicate argument name in definition: %s\n", defn[n].name);
                goto error;
            }
        }
    }
    else {
        /* No definitions. */
        n = 0;
    }

    /* Allocate memory for argument values */
    if (cmdln->ht == NULL)
        cmdln->ht = hash_table_new(n, 0 /* argument names are case-sensitive */ );


    /* skip argv[0] if it doesn't start with dash */
    argstart = 0;
    if (argc > 0 && argv[0][0] != '-') {
        argstart = 1;
    }

    /* Parse command line arguments (name-value pairs) */
    for (j = argstart; j < argc; j += 2) {
        arg_t *argdef;
        cmd_ln_val_t *val;
        void *v;

        if (hash_table_lookup(defidx, argv[j], &v) < 0) {
            if (strict) {
                E_ERROR("Unknown argument name '%s'\n", argv[j]);
                goto error;
            }
            else if (defn == NULL)
                v = NULL;
            else
                continue;
        }
        argdef = (arg_t *)v;

        /* Enter argument value */
        if (j + 1 >= argc) {
            cmd_ln_print_help_r(cmdln, stderr, defn);
            E_ERROR("Argument value for '%s' missing\n", argv[j]);
            goto error;
        }

        if (argdef == NULL)
            val = cmd_ln_val_init(ARG_STRING, argv[j], argv[j + 1]);
        else {
            if ((val = cmd_ln_val_init(argdef->type, argv[j], argv[j + 1])) == NULL) {
                cmd_ln_print_help_r(cmdln, stderr, defn);
                E_ERROR("Bad argument value for %s: %s\n", argv[j],
                        argv[j + 1]);
                goto error;
            }
        }

        if ((v = hash_table_enter(cmdln->ht, val->name, (void *)val)) !=
            (void *)val)
        {
            if (strict) {
                cmd_ln_val_free(val);
                E_ERROR("Duplicate argument name in arguments: %s\n",
                        argdef->name);
                goto error;
            }
            else {
                v = hash_table_replace(cmdln->ht, val->name, (void *)val);
                cmd_ln_val_free((cmd_ln_val_t *)v);
            }
        }
    }

    /* Fill in default values, if any, for unspecified arguments */
    for (i = 0; i < n; i++) {
        cmd_ln_val_t *val;
        void *v;

        if (hash_table_lookup(cmdln->ht, defn[i].name, &v) < 0) {
            if ((val = cmd_ln_val_init(defn[i].type, defn[i].name, defn[i].deflt)) == NULL) {
                E_ERROR
                    ("Bad default argument value for %s: %s\n",
                     defn[i].name, defn[i].deflt);
                goto error;
            }
            hash_table_enter(cmdln->ht, val->name, (void *)val);
        }
    }

    /* Check for required arguments; exit if any missing */
    j = 0;
    for (i = 0; i < n; i++) {
        if (defn[i].type & ARG_REQUIRED) {
            void *v;
            if (hash_table_lookup(cmdln->ht, defn[i].name, &v) != 0)
                E_ERROR("Missing required argument %s\n", defn[i].name);
        }
    }
    if (j > 0) {
        cmd_ln_print_help_r(cmdln, stderr, defn);
        goto error;
    }

    if (strict && argc == 1) {
        E_ERROR("No arguments given, available options are:\n");
        cmd_ln_print_help_r(cmdln, stderr, defn);
        if (defidx)
            hash_table_free(defidx);
        if (inout_cmdln == NULL)
            cmd_ln_free_r(cmdln);
        return NULL;
    }

    /* Print current values always in SphinxTrain */
    if (err_get_logfp())
	cmd_ln_print_values_r(cmdln, err_get_logfp(), defn);

    hash_table_free(defidx);
    return cmdln;

  error:
    if (defidx)
        hash_table_free(defidx);
    if (inout_cmdln == NULL)
        cmd_ln_free_r(cmdln);
    E_ERROR("Failed to parse arguments list\n");
    return NULL;
}